

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaSetValidStructuredErrors
               (xmlSchemaValidCtxtPtr ctxt,xmlStructuredErrorFunc serror,void *ctx)

{
  if (ctxt != (xmlSchemaValidCtxtPtr)0x0) {
    ctxt->serror = serror;
    ctxt->error = (xmlSchemaValidityErrorFunc)0x0;
    ctxt->warning = (xmlSchemaValidityWarningFunc)0x0;
    ctxt->errCtxt = ctx;
    if (ctxt->pctxt != (xmlSchemaParserCtxtPtr)0x0) {
      xmlSchemaSetParserStructuredErrors(ctxt->pctxt,serror,ctx);
      return;
    }
  }
  return;
}

Assistant:

void
xmlSchemaSetValidStructuredErrors(xmlSchemaValidCtxtPtr ctxt,
				  xmlStructuredErrorFunc serror, void *ctx)
{
    if (ctxt == NULL)
        return;
    ctxt->serror = serror;
    ctxt->error = NULL;
    ctxt->warning = NULL;
    ctxt->errCtxt = ctx;
    if (ctxt->pctxt != NULL)
	xmlSchemaSetParserStructuredErrors(ctxt->pctxt, serror, ctx);
}